

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::doShowAttachment(QPDFJob *this,QPDF *pdf)

{
  runtime_error *this_00;
  long *plVar1;
  element_type *peVar2;
  QPDFObjectHandle efs;
  shared_ptr<QPDFFileSpecObjectHelper> fs;
  QPDFEmbeddedFileDocumentHelper efdh;
  QPDFLogger local_90;
  element_type *local_80;
  _Alloc_hider _Stack_78;
  undefined1 local_70 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  string local_40;
  
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)&local_40,pdf);
  QPDFEmbeddedFileDocumentHelper::getEmbeddedFile
            ((QPDFEmbeddedFileDocumentHelper *)(local_70 + 0x20),&local_40);
  if ((string *)local_70._32_8_ != (string *)0x0) {
    local_90.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    QPDFFileSpecObjectHelper::getEmbeddedFileStream
              ((QPDFFileSpecObjectHelper *)local_70,(string *)local_70._32_8_);
    if (local_90.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)&local_80) {
      operator_delete(local_90.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(ulong)((long)&local_80->_vptr_Pipeline + 1));
    }
    QPDFLogger::saveToStandardOutput
              ((((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
    QPDFLogger::getSave(&local_90,
                        SUB81((((this->m).
                                super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->log).
                              super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
    QPDFObjectHandle::pipeStreamData
              ((QPDFObjectHandle *)local_70,
               (Pipeline *)
               local_90.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,0,qpdf_dl_all,false,false);
    if (local_90.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
    if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
    }
    QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
              ((QPDFEmbeddedFileDocumentHelper *)&local_40);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 "attachment ",
                 &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->attachment_to_show);
  plVar1 = (long *)std::__cxx11::string::append(local_70);
  local_90.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*plVar1;
  peVar2 = (element_type *)(plVar1 + 2);
  if (local_90.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      peVar2) {
    local_80 = (peVar2->p_discard).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Stack_78._M_p = (pointer)plVar1[3];
    local_90.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_80;
  }
  else {
    local_80 = (peVar2->p_discard).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  local_90.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar1[1];
  *plVar1 = (long)peVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_90);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDFJob::doShowAttachment(QPDF& pdf)
{
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    auto fs = efdh.getEmbeddedFile(m->attachment_to_show);
    if (!fs) {
        throw std::runtime_error("attachment " + m->attachment_to_show + " not found");
    }
    auto efs = fs->getEmbeddedFileStream();
    // saveToStandardOutput has already been called, but it's harmless to call it again, so do as
    // defensive coding.
    m->log->saveToStandardOutput(true);
    efs.pipeStreamData(m->log->getSave().get(), 0, qpdf_dl_all);
}